

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

void __thiscall re2::DFA::ClearCache(DFA *this)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  
  p_Var2 = (this->state_cache_)._M_h._M_before_begin._M_nxt;
  while (p_Var2 != (_Hash_node_base *)0x0) {
    p_Var1 = p_Var2->_M_nxt;
    operator_delete(p_Var2[1]._M_nxt);
    p_Var2 = p_Var1;
  }
  std::
  _Hashtable<re2::DFA::State_*,_re2::DFA::State_*,_std::allocator<re2::DFA::State_*>,_std::__detail::_Identity,_re2::DFA::StateEqual,_re2::DFA::StateHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::clear(&(this->state_cache_)._M_h);
  return;
}

Assistant:

void DFA::ClearCache() {
  StateSet::iterator begin = state_cache_.begin();
  StateSet::iterator end = state_cache_.end();
  while (begin != end) {
    StateSet::iterator tmp = begin;
    ++begin;
    // Deallocate the blob of memory that we allocated in DFA::CachedState().
    // We recompute mem in order to benefit from sized delete where possible.
    int ninst = (*tmp)->ninst_;
    int nnext = prog_->bytemap_range() + 1;  // + 1 for kByteEndText slot
    int mem = sizeof(State) + nnext*sizeof(std::atomic<State*>) +
              ninst*sizeof(int);
    std::allocator<char>().deallocate(reinterpret_cast<char*>(*tmp), mem);
  }
  state_cache_.clear();
}